

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtls_openssl.cpp
# Opt level: O3

void __thiscall
QTlsPrivate::TlsCryptographOpenSSL::alertMessageReceived(TlsCryptographOpenSSL *this,int value)

{
  QSslSocket *pQVar1;
  char *pcVar2;
  AlertType AVar3;
  long in_FS_OFFSET;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->q;
  pcVar2 = q_SSL_alert_type_string(value);
  if (pcVar2 == (char *)0x0) {
    AVar3 = 2;
  }
  else {
    AVar3 = CloseNotify;
    if (*pcVar2 != 'W') {
      AVar3 = (*pcVar2 != 'F') + 1;
    }
  }
  anon_unknown.dwarf_1322f2::tlsAlertDescription(&local_48,value);
  QSslSocket::alertReceived((AlertLevel)pQVar1,AVar3,(QString *)((ulong)(uint)value & 0xff));
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TlsCryptographOpenSSL::alertMessageReceived(int value)
{
    Q_ASSERT(q);

    emit q->alertReceived(tlsAlertLevel(value), tlsAlertType(value), tlsAlertDescription(value));
}